

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnoncontiguousbytedevice.cpp
# Opt level: O2

void __thiscall
QNonContiguousByteDeviceIoDeviceImpl::QNonContiguousByteDeviceIoDeviceImpl
          (QNonContiguousByteDeviceIoDeviceImpl *this,QIODevice *d)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  Object local_38;
  undefined8 local_28;
  Object local_20;
  
  local_20.super_QObject.d_ptr.d = *(QObjectData **)(in_FS_OFFSET + 0x28);
  QNonContiguousByteDevice::QNonContiguousByteDevice((QNonContiguousByteDevice *)this);
  *(undefined ***)this = &PTR_metaObject_00661950;
  *(QIODevice **)(this + 0x10) = d;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0x4000;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x31) = 0;
  *(undefined8 *)(this + 0x39) = 0;
  iVar1 = (*(d->super_QObject)._vptr_QObject[0xf])(d);
  *(ulong *)(this + 0x48) = CONCAT44(extraout_var,iVar1);
  local_38.super_QObject.d_ptr.d = (QObjectData *)QNonContiguousByteDevice::readyRead;
  local_28 = 0;
  QObject::connect<void(QIODevice::*)(),void(QNonContiguousByteDevice::*)()>
            (&local_20,*(offset_in_QIODevice_to_subr *)(this + 0x10),
             (ContextType *)QIODevice::readyRead,(offset_in_QNonContiguousByteDevice_to_subr *)0x0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&local_20);
  local_38.super_QObject.d_ptr.d = (QObjectData *)QNonContiguousByteDevice::readyRead;
  local_28 = 0;
  QObject::connect<void(QIODevice::*)(),void(QNonContiguousByteDevice::*)()>
            (&local_38,*(offset_in_QIODevice_to_subr *)(this + 0x10),
             (ContextType *)QIODevice::readChannelFinished,
             (offset_in_QNonContiguousByteDevice_to_subr *)0x0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&local_38);
  if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNonContiguousByteDeviceIoDeviceImpl::QNonContiguousByteDeviceIoDeviceImpl(QIODevice *d)
    : QNonContiguousByteDevice(),
      device(d),
      currentReadBuffer(nullptr),
      currentReadBufferSize(16 * 1024),
      currentReadBufferAmount(0),
      currentReadBufferPosition(0),
      totalAdvancements(0),
      eof(false),
      initialPosition(d->pos())
{
    connect(device, &QIODevice::readyRead, this,
            &QNonContiguousByteDevice::readyRead);
    connect(device, &QIODevice::readChannelFinished, this,
            &QNonContiguousByteDevice::readyRead);
}